

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_x86_avx512.cpp
# Opt level: O1

int __thiscall
ncnn::Convolution_x86_avx512::forwardDilation_x86
          (Convolution_x86_avx512 *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  int iVar6;
  size_t _elemsize;
  size_t sVar7;
  size_t sVar8;
  Layer *pLVar9;
  ulong uVar10;
  int *piVar11;
  int iVar12;
  void *pvVar13;
  ulong uVar14;
  void *pvVar15;
  undefined4 *puVar16;
  ulong uVar17;
  int iVar18;
  int iVar19;
  uint _w;
  long lVar20;
  undefined4 *puVar21;
  ulong uVar22;
  long lVar23;
  int iVar24;
  ulong uVar25;
  uint _h;
  undefined4 *puVar26;
  bool bVar27;
  Option opt_g;
  long local_180;
  long local_178;
  Mat local_158;
  Mat local_108;
  long local_b8;
  ulong local_b0;
  long local_a8;
  long local_a0;
  ulong local_98;
  ulong local_90;
  long local_88;
  long local_80;
  undefined8 local_78;
  Allocator *pAStack_70;
  undefined1 auStack_68 [48];
  
  iVar1 = bottom_blob->w;
  iVar2 = bottom_blob->h;
  _elemsize = bottom_blob->elemsize;
  iVar3 = (this->super_Convolution).kernel_w;
  iVar4 = (this->super_Convolution).stride_w;
  uVar5 = (this->super_Convolution).dilation_w;
  uVar22 = (ulong)uVar5;
  iVar19 = (iVar3 + -1) * uVar5 + 1;
  iVar12 = (iVar1 - iVar19) / iVar4;
  iVar18 = iVar12 + 1;
  Mat::create(top_blob,iVar18,(iVar2 - iVar19) / iVar4 + 1,(this->super_Convolution).num_output,
              _elemsize,opt->blob_allocator);
  iVar19 = -100;
  if ((top_blob->data != (void *)0x0) && ((long)top_blob->c * top_blob->cstep != 0)) {
    local_108.cstep = 0;
    local_108.data = (void *)0x0;
    local_108.refcount._0_4_ = 0;
    local_108.refcount._4_4_ = 0;
    local_108.elemsize._0_4_ = 0;
    local_108.elemsize._4_4_ = 0;
    local_108.elempack = 0;
    local_108.allocator = (Allocator *)0x0;
    local_108.dims = 0;
    local_108.w = 0;
    local_108.h = 0;
    local_108.d = 0;
    local_108.c = 0;
    local_158.cstep = 0;
    local_158.data = (void *)0x0;
    local_158.refcount._0_4_ = 0;
    local_158.refcount._4_4_ = 0;
    local_158.elemsize._0_4_ = 0;
    local_158.elemsize._4_4_ = 0;
    local_158.elempack = 0;
    local_158.allocator = (Allocator *)0x0;
    local_158.dims = 0;
    local_158.w = 0;
    local_158.h = 0;
    local_158.d = 0;
    local_158.c = 0;
    bVar27 = 0 < (int)uVar5;
    if (0 < (int)uVar5) {
      local_b8 = (long)iVar12 * 4 + 4;
      local_80 = (long)(int)(iVar18 * uVar5) << 2;
      local_180 = 0;
      local_178 = 0;
      uVar14 = 0;
      do {
        uVar10 = (long)(int)((uVar5 + iVar2 + -1) - (int)uVar14) / (long)(int)uVar5;
        iVar12 = (int)uVar10;
        uVar17 = (long)(iVar12 - iVar3) / (long)iVar4;
        local_90 = uVar17 & 0xffffffff;
        _h = (int)uVar17 + 1;
        uVar17 = 0;
        local_b0 = uVar14;
        local_a8 = local_178;
        local_a0 = local_180;
        do {
          uVar14 = (long)(int)((uVar5 + iVar1 + -1) - (int)uVar17) / (long)(int)uVar5;
          iVar18 = (int)uVar14;
          iVar19 = (iVar18 - iVar3) / iVar4;
          local_98 = uVar17;
          Mat::create(&local_108,iVar18,iVar12,bottom_blob->c,_elemsize,opt->workspace_allocator);
          if ((local_108.data == (void *)0x0) || ((long)local_108.c * local_108.cstep == 0)) {
LAB_0019b205:
            iVar19 = -100;
            if (bVar27) goto LAB_0019b233;
            goto LAB_0019b211;
          }
          _w = iVar19 + 1;
          Mat::create(&local_158,_w,_h,(this->super_Convolution).num_output,_elemsize,
                      opt->workspace_allocator);
          if ((local_158.data == (void *)0x0) || ((long)local_158.c * local_158.cstep == 0))
          goto LAB_0019b205;
          iVar6 = bottom_blob->c;
          if (0 < (long)iVar6) {
            lVar20 = (long)bottom_blob->data + local_178;
            local_88 = bottom_blob->cstep * bottom_blob->elemsize;
            lVar23 = 0;
            pvVar13 = local_108.data;
            do {
              if (0 < iVar12) {
                iVar24 = 0;
                uVar17 = 0;
                pvVar15 = pvVar13;
                do {
                  if (0 < iVar18) {
                    puVar16 = (undefined4 *)(lVar20 + (long)iVar24 * 4);
                    uVar25 = 0;
                    do {
                      *(undefined4 *)((long)pvVar15 + uVar25 * 4) = *puVar16;
                      uVar25 = uVar25 + 1;
                      puVar16 = puVar16 + uVar22;
                    } while ((uVar14 & 0xffffffff) != uVar25);
                  }
                  uVar17 = uVar17 + 1;
                  iVar24 = iVar24 + uVar5 * iVar1;
                  pvVar15 = (void *)((long)pvVar15 + (long)iVar18 * 4);
                } while (uVar17 != (uVar10 & 0xffffffff));
              }
              lVar23 = lVar23 + 1;
              lVar20 = lVar20 + local_88;
              pvVar13 = (void *)((long)pvVar13 +
                                local_108.cstep *
                                CONCAT44(local_108.elemsize._4_4_,(undefined4)local_108.elemsize));
            } while (lVar23 != iVar6);
          }
          auStack_68 = SUB6448(*opt,0x10);
          local_78 = SUB648(*opt,0);
          pAStack_70 = local_158.allocator;
          (*this->convolution_dilation1->_vptr_Layer[7])
                    (this->convolution_dilation1,&local_108,&local_158,&local_78);
          lVar20 = (long)(this->super_Convolution).num_output;
          if (0 < lVar20) {
            sVar7 = top_blob->cstep;
            puVar16 = (undefined4 *)((long)top_blob->data + local_180);
            sVar8 = top_blob->elemsize;
            lVar23 = 0;
            pvVar13 = local_158.data;
            do {
              if (-1 < (int)local_90) {
                uVar14 = 0;
                puVar21 = puVar16;
                pvVar15 = pvVar13;
                do {
                  if (-1 < iVar19) {
                    uVar17 = 0;
                    puVar26 = puVar21;
                    do {
                      *puVar26 = *(undefined4 *)((long)pvVar15 + uVar17 * 4);
                      uVar17 = uVar17 + 1;
                      puVar26 = puVar26 + uVar22;
                    } while (_w != uVar17);
                  }
                  uVar14 = uVar14 + 1;
                  puVar21 = (undefined4 *)((long)puVar21 + local_80);
                  pvVar15 = (void *)((long)pvVar15 + (long)(int)_w * 4);
                } while (uVar14 != _h);
              }
              lVar23 = lVar23 + 1;
              puVar16 = (undefined4 *)((long)puVar16 + sVar7 * sVar8);
              pvVar13 = (void *)((long)pvVar13 +
                                local_158.cstep *
                                CONCAT44(local_158.elemsize._4_4_,(undefined4)local_158.elemsize));
            } while (lVar23 != lVar20);
          }
          uVar17 = local_98 + 1;
          local_178 = local_178 + 4;
          local_180 = local_180 + 4;
        } while (uVar17 != uVar22);
        uVar14 = local_b0 + 1;
        bVar27 = uVar14 < uVar22;
        local_178 = local_a8 + (long)iVar1 * 4;
        local_180 = local_a0 + local_b8;
      } while (uVar14 != uVar22);
    }
LAB_0019b211:
    pLVar9 = this->activation;
    if (pLVar9 == (Layer *)0x0) {
      iVar19 = 0;
    }
    else {
      (*pLVar9->_vptr_Layer[9])(pLVar9,top_blob,opt);
      iVar19 = 0;
    }
LAB_0019b233:
    piVar11 = (int *)CONCAT44(local_158.refcount._4_4_,local_158.refcount._0_4_);
    if (piVar11 != (int *)0x0) {
      LOCK();
      *piVar11 = *piVar11 + -1;
      UNLOCK();
      if (*piVar11 == 0) {
        if (local_158.allocator == (Allocator *)0x0) {
          if (local_158.data != (void *)0x0) {
            free(local_158.data);
          }
        }
        else {
          (*(local_158.allocator)->_vptr_Allocator[3])();
        }
      }
    }
    local_158.cstep = 0;
    local_158.data = (void *)0x0;
    local_158.refcount._0_4_ = 0;
    local_158.refcount._4_4_ = 0;
    local_158.elemsize._0_4_ = 0;
    local_158.elemsize._4_4_ = 0;
    local_158.elempack = 0;
    local_158.dims = 0;
    local_158.w = 0;
    local_158.h = 0;
    local_158.d = 0;
    local_158.c = 0;
    piVar11 = (int *)CONCAT44(local_108.refcount._4_4_,local_108.refcount._0_4_);
    if (piVar11 != (int *)0x0) {
      LOCK();
      *piVar11 = *piVar11 + -1;
      UNLOCK();
      if (*piVar11 == 0) {
        if (local_108.allocator == (Allocator *)0x0) {
          if (local_108.data != (void *)0x0) {
            free(local_108.data);
          }
        }
        else {
          (*(local_108.allocator)->_vptr_Allocator[3])();
        }
      }
    }
  }
  return iVar19;
}

Assistant:

int Convolution_x86_avx512::forwardDilation_x86(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    int w = bottom_blob.w;
    int h = bottom_blob.h;
    size_t elemsize = bottom_blob.elemsize;

    const int kernel_size = kernel_w;
    const int stride = stride_w;
    const int dilation = dilation_w;
    const int kernel_extent = dilation * (kernel_size - 1) + 1;

    int outw = (w - kernel_extent) / stride + 1;
    int outh = (h - kernel_extent) / stride + 1;

    top_blob.create(outw, outh, num_output, elemsize, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    // Make (dilation * dilation) batches
    Mat inner_bottom_blob;
    Mat inner_top_blob;
    for (int x = 0; x < dilation; x++)
    {
        for (int y = 0; y < dilation; y++)
        {
            int inner_w = (w - y + dilation - 1) / dilation;
            int inner_h = (h - x + dilation - 1) / dilation;

            int inner_outw = (inner_w - kernel_size) / stride + 1;
            int inner_outh = (inner_h - kernel_size) / stride + 1;

            inner_bottom_blob.create(inner_w, inner_h, bottom_blob.c, elemsize, opt.workspace_allocator);
            if (inner_bottom_blob.empty())
                return -100;

            inner_top_blob.create(inner_outw, inner_outh, num_output, elemsize, opt.workspace_allocator);
            if (inner_top_blob.empty())
                return -100;

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int c = 0; c < bottom_blob.c; c++)
            {
                float* outptr = inner_bottom_blob.channel(c);

                for (int i = 0; i < inner_h; i++)
                {
                    const float* ptr = (const float*)bottom_blob.channel(c) + dilation * i * w + x * w + y;
                    for (int j = 0; j < inner_w; j++)
                    {
                        outptr[j] = ptr[j * dilation];
                    }
                    outptr += inner_w;
                }
            }

            Option opt_g = opt;
            opt_g.blob_allocator = inner_top_blob.allocator;
            convolution_dilation1->forward(inner_bottom_blob, inner_top_blob, opt_g);

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int c = 0; c < num_output; c++)
            {
                float* outptr = (float*)top_blob.channel(c) + x * outw + y;
                for (int i = 0; i < inner_outh; i++)
                {
                    const float* ptr = (const float*)inner_top_blob.channel(c) + i * inner_outw;
                    for (int j = 0; j < inner_outw; j++)
                    {
                        outptr[j * dilation] = ptr[j];
                    }
                    outptr += dilation * outw;
                }
            }
        }
    }

    if (activation)
    {
        activation->forward_inplace(top_blob, opt);
    }

    return 0;
}